

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

qualifierSet *
gl4cts::GLSL420Pack::Utils::prepareQualifiersSet
          (qualifierSet *__return_storage_ptr__,qualifierSet *in_qualifiers,SHADER_STAGES stage,
          VARIABLE_STORAGE storage)

{
  iterator __position;
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  QUALIFIERS qualifier_00;
  pointer pQVar4;
  pointer pQVar5;
  QUALIFIERS qualifier;
  QUALIFIERS local_40;
  SHADER_STAGES local_3c;
  qualifierSet *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pQVar5 = (in_qualifiers->
           super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pQVar4 = (in_qualifiers->
           super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pQVar4 != pQVar5) {
    uVar2 = 0;
    uVar3 = 1;
    local_3c = stage;
    local_38 = in_qualifiers;
    do {
      qualifier_00 = pQVar5[uVar2];
      local_40 = qualifier_00;
      bVar1 = doesStageSupportQualifier(local_3c,storage,qualifier_00);
      if (bVar1) {
        if (storage == UNIFORM) {
          if ((qualifier_00 & ~QUAL_CONST) == QUAL_IN) {
            local_40 = QUAL_UNIFORM;
            qualifier_00 = QUAL_UNIFORM;
          }
        }
        else if (storage == OUTPUT) {
          if ((qualifier_00 == QUAL_UNIFORM) || (qualifier_00 == QUAL_IN)) {
            local_40 = QUAL_OUT;
            qualifier_00 = QUAL_OUT;
          }
        }
        else if ((storage == INPUT) &&
                ((qualifier_00 == QUAL_UNIFORM || (qualifier_00 == QUAL_OUT)))) {
          local_40 = QUAL_IN;
          qualifier_00 = QUAL_IN;
        }
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>>
          ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS_const&>
                    ((vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>>
                      *)__return_storage_ptr__,__position,&local_40);
          pQVar5 = (local_38->
                   super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pQVar4 = (local_38->
                   super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          *__position._M_current = qualifier_00;
          (__return_storage_ptr__->
          super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
          )._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      bVar1 = uVar3 < (ulong)((long)pQVar4 - (long)pQVar5 >> 2);
      uVar2 = uVar3;
      uVar3 = (ulong)((int)uVar3 + 1);
    } while (bVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

Utils::qualifierSet Utils::prepareQualifiersSet(const qualifierSet& in_qualifiers, SHADER_STAGES stage,
												VARIABLE_STORAGE storage)
{
	qualifierSet result;

	for (GLuint i = 0; i < in_qualifiers.size(); ++i)
	{
		Utils::QUALIFIERS qualifier = in_qualifiers[i];

		if (false == doesStageSupportQualifier(stage, storage, qualifier))
		{
			continue;
		};

		/* Replace wrong storage qualifiers */
		if ((Utils::INPUT == storage) && ((Utils::QUAL_UNIFORM == qualifier) || (Utils::QUAL_OUT == qualifier)))
		{
			qualifier = QUAL_IN;
		}
		else if ((Utils::OUTPUT == storage) && ((Utils::QUAL_IN == qualifier) || (Utils::QUAL_UNIFORM == qualifier)))
		{
			qualifier = QUAL_OUT;
		}
		else if ((Utils::UNIFORM == storage) && ((Utils::QUAL_IN == qualifier) || (Utils::QUAL_OUT == qualifier)))
		{
			qualifier = QUAL_UNIFORM;
		}

		result.push_back(qualifier);
	}

	return result;
}